

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O1

void avro::json::testNull(void)

{
  Entity n;
  long *local_b8;
  undefined4 local_b0;
  int local_ac;
  undefined4 *local_a8;
  int *local_a0;
  assertion_result local_98;
  const_string local_80;
  lazy_ostream local_70;
  undefined8 *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  undefined4 **local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  int **local_18;
  
  avro::json::loadEntity((char *)&n);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x66;
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001c0950;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_a0 = &local_ac;
  local_ac = _n;
  local_a8 = &local_b0;
  local_b0 = 0;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_n == 0);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_80.m_end = "";
  local_18 = &local_a0;
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_001c0990;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_38 = &local_a8;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_001c0990;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_70,&local_80,0x66,CHECK,CHECK_EQUAL,2,"n.type()",&local_30,"etNull",
             &local_50);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 8))();
  }
  return;
}

Assistant:

static void testNull()
{
    Entity n = loadEntity("null");
    BOOST_CHECK_EQUAL(n.type(), etNull);

}